

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void __thiscall Engine::toggleVSIDS(Engine *this)

{
  uint i;
  ulong uVar1;
  vec<Branching_*> local_28;
  
  if (so.vsids) {
    local_28.sz = 0;
    local_28.cap = 0;
    local_28.data = (Branching **)0x0;
    vec<Branching_*>::moveTo(&this->branching->x,&local_28);
    for (uVar1 = 1; uVar1 < (local_28._0_8_ & 0xffffffff); uVar1 = uVar1 + 1) {
      (*(this->branching->super_Branching)._vptr_Branching[3])();
    }
    Tint::operator=(&this->branching->fin,0);
    Tint::operator=(&this->branching->cur,-1);
    so.vsids = false;
  }
  else {
    local_28.sz = 0;
    local_28.cap = 0;
    local_28.data = (Branching **)0x0;
    vec<Branching_*>::moveTo(&this->branching->x,&local_28);
    (*(this->branching->super_Branching)._vptr_Branching[3])();
    for (uVar1 = 0; uVar1 < (local_28._0_8_ & 0xffffffff); uVar1 = uVar1 + 1) {
      (*(this->branching->super_Branching)._vptr_Branching[3])();
    }
    Tint::operator=(&this->branching->fin,0);
    Tint::operator=(&this->branching->cur,-1);
    so.vsids = true;
  }
  free(local_28.data);
  return;
}

Assistant:

void Engine::toggleVSIDS() const {
	if (!so.vsids) {
		vec<Branching*> old_x;
		branching->x.moveTo(old_x);
		branching->add(&sat);
		for (unsigned int i = 0; i < old_x.size(); i++) {
			branching->add(old_x[i]);
		}
		branching->fin = 0;
		branching->cur = -1;
		so.vsids = true;
	} else {
		vec<Branching*> old_x;
		branching->x.moveTo(old_x);
		for (unsigned int i = 1; i < old_x.size(); i++) {
			branching->add(old_x[i]);
		}
		branching->fin = 0;
		branching->cur = -1;
		so.vsids = false;
	}
}